

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O3

void __thiscall
Js::Utf8SourceInfo::TrackDeferredFunction
          (Utf8SourceInfo *this,LocalFunctionId functionID,ParseableFunctionInfo *function)

{
  SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseableFunctionInfo *local_28;
  ParseableFunctionInfo *function_local;
  LocalFunctionId functionID_local;
  
  local_28 = function;
  function_local._4_4_ = functionID;
  bVar2 = ScriptContext::DoUndeferGlobalFunctions((this->m_scriptContext).ptr);
  if (bVar2) {
    if ((this->field_0xa8 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                  ,0x183,"(m_deferredFunctionsInitialized)",
                                  "m_deferredFunctionsInitialized");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    this_00 = (this->m_deferredFunctionsDictionary).ptr;
    if (this_00 !=
        (SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
         *)0x0) {
      JsUtil::
      SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
      ::Add(this_00,(uint *)((long)&function_local + 4),&local_28);
    }
  }
  return;
}

Assistant:

void Utf8SourceInfo::TrackDeferredFunction(Js::LocalFunctionId functionID, Js::ParseableFunctionInfo *function)
    {
        if (this->m_scriptContext->DoUndeferGlobalFunctions())
        {
            Assert(m_deferredFunctionsInitialized);
            if (this->m_deferredFunctionsDictionary != nullptr)
            {
                this->m_deferredFunctionsDictionary->Add(functionID, function);
            }
        }
    }